

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<long,duckdb::interval_t,duckdb::interval_t,duckdb::BinaryStandardOperatorWrapper,duckdb::MultiplyOperator,bool,true,false>
               (long *ldata,interval_t *rdata,interval_t *result_data,idx_t count,ValidityMask *mask
               ,bool fun)

{
  unsigned_long *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  idx_t iVar10;
  ulong uVar11;
  bool bVar12;
  interval_t iVar13;
  interval_t left;
  interval_t left_00;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    lVar7 = 8;
    iVar10 = count;
    while (bVar12 = iVar10 != 0, iVar10 = iVar10 - 1, bVar12) {
      iVar13.micros = *ldata;
      iVar13._0_8_ = *(undefined8 *)((long)&rdata->months + lVar7);
      iVar13 = MultiplyOperator::Operation<duckdb::interval_t,long,duckdb::interval_t>
                         (*(MultiplyOperator **)((long)rdata + lVar7 + -8),iVar13,count);
      *(long *)((long)result_data + lVar7 + -8) = iVar13._0_8_;
      *(int64_t *)((long)&result_data->months + lVar7) = iVar13.micros;
      lVar7 = lVar7 + 0x10;
    }
  }
  else {
    uVar8 = 0;
    for (uVar4 = 0; uVar4 != count + 0x3f >> 6; uVar4 = uVar4 + 1) {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar11 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar11 = count;
        }
LAB_01509f2f:
        uVar5 = uVar8 << 4 | 8;
        uVar3 = uVar4;
        for (; uVar2 = uVar8, uVar8 < uVar11; uVar8 = uVar8 + 1) {
          left.micros = *ldata;
          left._0_8_ = *(undefined8 *)((long)&rdata->months + uVar5);
          iVar13 = MultiplyOperator::Operation<duckdb::interval_t,long,duckdb::interval_t>
                             (*(MultiplyOperator **)((long)rdata + (uVar5 - 8)),left,uVar3);
          *(long *)((long)result_data + (uVar5 - 8)) = iVar13._0_8_;
          *(int64_t *)((long)&result_data->months + uVar5) = iVar13.micros;
          uVar5 = uVar5 + 0x10;
        }
      }
      else {
        uVar3 = puVar1[uVar4];
        uVar11 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar11 = count;
        }
        if (uVar3 == 0xffffffffffffffff) goto LAB_01509f2f;
        uVar2 = uVar11;
        if (uVar3 != 0) {
          uVar6 = uVar8 << 4 | 8;
          uVar5 = uVar4;
          for (uVar9 = 0; uVar2 = uVar9 + uVar8, uVar9 + uVar8 < uVar11; uVar9 = uVar9 + 1) {
            if ((uVar3 >> (uVar9 & 0x3f) & 1) != 0) {
              left_00.micros = *ldata;
              left_00._0_8_ = *(undefined8 *)((long)&rdata->months + uVar6);
              iVar13 = MultiplyOperator::Operation<duckdb::interval_t,long,duckdb::interval_t>
                                 (*(MultiplyOperator **)((long)rdata + (uVar6 - 8)),left_00,uVar5);
              *(long *)((long)result_data + (uVar6 - 8)) = iVar13._0_8_;
              *(int64_t *)((long)&result_data->months + uVar6) = iVar13.micros;
            }
            uVar6 = uVar6 + 0x10;
          }
        }
      }
      uVar8 = uVar2;
    }
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}